

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::internal::TrackRegistry::UpdateTrackImpl
          (TrackRegistry *this,Track track,
          function<void_(perfetto::protos::pbzero::TrackDescriptor_*)> *fill_function)

{
  string serialized_desc;
  HeapBuffered<perfetto::protos::pbzero::TrackDescriptor> new_descriptor;
  
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::HeapBuffered
            (&new_descriptor,0x20,0x1000);
  std::function<void_(perfetto::protos::pbzero::TrackDescriptor_*)>::operator()
            (fill_function,&new_descriptor.msg_.super_TrackDescriptor);
  protozero::HeapBuffered<perfetto::protos::pbzero::TrackDescriptor>::SerializeAsString_abi_cxx11_
            (&serialized_desc,&new_descriptor);
  UpdateTrack(this,track,&serialized_desc);
  ::std::__cxx11::string::~string((string *)&serialized_desc);
  protozero::MessageArena::~MessageArena(&new_descriptor.msg_.root_arena_);
  protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&new_descriptor.writer_);
  protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&new_descriptor.shb_);
  return;
}

Assistant:

void TrackRegistry::UpdateTrackImpl(
    Track track,
    std::function<void(protos::pbzero::TrackDescriptor*)> fill_function) {
  constexpr size_t kInitialSliceSize = 32;
  constexpr size_t kMaximumSliceSize = 4096;
  protozero::HeapBuffered<protos::pbzero::TrackDescriptor> new_descriptor(
      kInitialSliceSize, kMaximumSliceSize);
  fill_function(new_descriptor.get());
  auto serialized_desc = new_descriptor.SerializeAsString();
  UpdateTrack(track, serialized_desc);
}